

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::get_type_id
          (Impl *this,ComponentType element_type,uint rows,uint cols,bool force_array)

{
  Id sizeId;
  Builder *this_00;
  LoggingCallback p_Var1;
  void *pvVar2;
  char local_1048 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Id component_type;
  Builder *builder;
  bool force_array_local;
  uint cols_local;
  uint rows_local;
  ComponentType element_type_local;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  switch(element_type) {
  case I1:
    cb._4_4_ = spv::Builder::makeUintType(this_00,0x20);
    break;
  case I16:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x10,true);
    break;
  case U16:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x10,false);
    break;
  case I32:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x20,true);
    break;
  case U32:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x20,false);
    break;
  case I64:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x40,true);
    break;
  case U64:
    cb._4_4_ = spv::Builder::makeIntegerType(this_00,0x40,false);
    break;
  case F16:
    cb._4_4_ = spv::Builder::makeFloatType(this_00,0x10);
    break;
  case F32:
    cb._4_4_ = spv::Builder::makeFloatType(this_00,0x20);
    break;
  case F64:
    cb._4_4_ = spv::Builder::makeFloatType(this_00,0x40);
    break;
  default:
    p_Var1 = get_thread_log_callback();
    if (p_Var1 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown component type.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1048,0x1000,"Unknown component type.\n");
      pvVar2 = get_thread_log_callback_userdata();
      (*p_Var1)(pvVar2,Error,local_1048);
    }
    return 0;
  }
  if (1 < cols) {
    cb._4_4_ = spv::Builder::makeVectorType(this_00,cb._4_4_,cols);
  }
  if ((1 < rows) || (force_array)) {
    sizeId = spv::Builder::makeUintConstant(this_00,rows,false);
    cb._4_4_ = spv::Builder::makeArrayType(this_00,cb._4_4_,sizeId,0);
  }
  return cb._4_4_;
}

Assistant:

spv::Id Converter::Impl::get_type_id(DXIL::ComponentType element_type, unsigned rows, unsigned cols, bool force_array)
{
	auto &builder = spirv_module.get_builder();

	spv::Id component_type;
	switch (element_type)
	{
	case DXIL::ComponentType::I1:
		// Cannot have bools in I/O interfaces, these are emitted as 32-bit integers.
		component_type = builder.makeUintType(32);
		break;

	case DXIL::ComponentType::I16:
		component_type = builder.makeIntegerType(16, true);
		break;

	case DXIL::ComponentType::U16:
		component_type = builder.makeIntegerType(16, false);
		break;

	case DXIL::ComponentType::I32:
		component_type = builder.makeIntegerType(32, true);
		break;

	case DXIL::ComponentType::U32:
		component_type = builder.makeIntegerType(32, false);
		break;

	case DXIL::ComponentType::I64:
		component_type = builder.makeIntegerType(64, true);
		break;

	case DXIL::ComponentType::U64:
		component_type = builder.makeIntegerType(64, false);
		break;

	case DXIL::ComponentType::F16:
		component_type = builder.makeFloatType(16);
		break;

	case DXIL::ComponentType::F32:
		component_type = builder.makeFloatType(32);
		break;

	case DXIL::ComponentType::F64:
		component_type = builder.makeFloatType(64);
		break;

	default:
		LOGE("Unknown component type.\n");
		return 0;
	}

	if (cols > 1)
		component_type = builder.makeVectorType(component_type, cols);
	if (rows > 1 || force_array)
		component_type = builder.makeArrayType(component_type, builder.makeUintConstant(rows), 0);
	return component_type;
}